

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void dam_message(CHAR_DATA *ch,CHAR_DATA *victim,int dam,int dt,bool immune,char *dnoun,bool reduced
                )

{
  CHAR_DATA *pCVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  OBJ_DATA *pOVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char **ppcVar11;
  size_t sVar12;
  char *__format;
  CHAR_DATA **ppCVar13;
  char *pcVar14;
  char *in_stack_fffffffffffffb88;
  undefined8 uVar15;
  undefined4 uVar16;
  char *local_468;
  char buf2 [256];
  char buf1 [256];
  char buf3 [256];
  char buf97 [256];
  
  iVar6 = 0;
  if (0 < dam) {
    iVar6 = dam;
  }
  if (victim == (CHAR_DATA *)0x0 || ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (victim->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (reduced) {
    local_468 = "\x1b[0mfails to harm";
    pcVar14 = "\x1b[0mfail to harm";
  }
  else if (dam < 1) {
    local_468 = "misses";
    pcVar14 = "miss";
  }
  else if ((uint)dam < 3) {
    local_468 = "scratches";
    pcVar14 = "scratch";
  }
  else if ((uint)dam < 5) {
    local_468 = "grazes";
    pcVar14 = "graze";
  }
  else if ((uint)dam < 8) {
    local_468 = "hits";
    pcVar14 = "hit";
  }
  else if ((uint)dam < 0xc) {
    local_468 = "injures";
    pcVar14 = "injure";
  }
  else if ((uint)dam < 0x10) {
    local_468 = "wounds";
    pcVar14 = "wound";
  }
  else if ((uint)dam < 0x15) {
    local_468 = "mauls";
    pcVar14 = "maul";
  }
  else if ((uint)dam < 0x1a) {
    local_468 = "decimates";
    pcVar14 = "decimate";
  }
  else if ((uint)dam < 0x1f) {
    local_468 = "devastates";
    pcVar14 = "devastate";
  }
  else if ((uint)dam < 0x26) {
    local_468 = "maims";
    pcVar14 = "maim";
  }
  else if ((uint)dam < 0x2e) {
    local_468 = "MUTILATES";
    pcVar14 = "MUTILATE";
  }
  else if ((uint)dam < 0x38) {
    local_468 = "EVISCERATES";
    pcVar14 = "EVISCERATE";
  }
  else if ((uint)dam < 0x42) {
    local_468 = "DISMEMBERS";
    pcVar14 = "DISMEMBER";
  }
  else if ((uint)dam < 0x56) {
    local_468 = "MASSACRES";
    pcVar14 = "MASSACRE";
  }
  else if ((uint)dam < 0x65) {
    local_468 = "MANGLES";
    pcVar14 = "MANGLE";
  }
  else if ((uint)dam < 0x88) {
    local_468 = "*** DEMOLISHES ***";
    pcVar14 = "*** DEMOLISH ***";
  }
  else if ((uint)dam < 0xa1) {
    local_468 = "*** DEVASTATES ***";
    pcVar14 = "*** DEVASTATE ***";
  }
  else if ((uint)dam < 0xfb) {
    local_468 = "=== OBLITERATES ===";
    pcVar14 = "=== OBLITERATE ===";
  }
  else if ((uint)dam < 0x14b) {
    local_468 = ">>> ANNIHILATES <<<";
    pcVar14 = ">>> ANNIHILATE <<<";
  }
  else {
    pcVar14 = "do UNSPEAKABLE things to";
    if ((uint)dam < 0x17d) {
      pcVar14 = "<<< ERADICATE >>>";
    }
    local_468 = "does UNSPEAKABLE things to";
    if ((uint)dam < 0x17d) {
      local_468 = "<<< ERADICATES >>>";
    }
  }
  uVar2 = 0x21;
  if (dam < 0x22) {
    uVar2 = 0x2e;
  }
  if (gsn_dual_wield == dt) {
    pOVar7 = get_eq_char(ch,0x12);
    if (pOVar7 == (OBJ_DATA *)0x0) {
      dt = (int)ch->dam_type + 1000;
    }
    else {
      dt = pOVar7->value[3] + 1000;
    }
  }
  if (dt != 1000) {
    if ((uint)dt < 800) {
      ppcVar11 = &skill_table[(uint)dt].noun_damage;
    }
    else if (dt - 1000U < 0x3e) {
      ppcVar11 = &attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl
                  .super__Vector_impl_data._M_start[dt - 1000U].noun;
    }
    else {
      ppcVar11 = &(attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>.
                   _M_impl.super__Vector_impl_data._M_start)->noun;
    }
    if (dnoun == (char *)0x0) {
      pcVar8 = *ppcVar11;
    }
    else {
      pcVar8 = palloc_string(dnoun);
    }
    bVar4 = dnoun != (char *)0x0;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
      if (!immune) goto LAB_002ed23d;
      goto LAB_002ed1c9;
    }
    sVar12 = strlen(pcVar8);
    if (pcVar8[sVar12 - 1] == '#') {
      pcVar9 = palloc_string(pcVar8);
      chop(pcVar9);
LAB_002ecf5f:
      if (bVar4) {
        free_pstring(pcVar8);
      }
      pcVar8 = palloc_string(pcVar9);
      free_pstring(pcVar9);
    }
    else if (pcVar8[sVar12 - 1] == '$') {
      pcVar9 = palloc_string(pcVar8);
      chop(pcVar9);
      local_468 = pcVar14;
      goto LAB_002ecf5f;
    }
    if (immune) {
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar12 = strlen(pcVar8);
        if (pcVar8[sVar12 - 1] == '*') {
          pcVar14 = palloc_string(pcVar8);
          chop(pcVar14);
          if (bVar4) {
            free_pstring(pcVar8);
          }
          pcVar8 = palloc_string(pcVar14);
          free_pstring(pcVar14);
          pcVar14 = "$N is unaffected by %s!";
          sprintf(buf1,"$N is unaffected by %s!",pcVar8);
          if (ch == victim) {
            pcVar14 = "You are unaffected by %s!";
          }
          sprintf(buf2,pcVar14,pcVar8);
          pcVar14 = "You are unaffected by %s!";
LAB_002ed67a:
          sprintf(buf3,pcVar14,pcVar8);
LAB_002ed684:
          bVar3 = true;
          bVar4 = true;
          goto LAB_002ed68a;
        }
      }
LAB_002ed1c9:
      if (ch != victim) {
        sprintf(buf1,"$N is unaffected by $n\'s %s!",pcVar8);
        sprintf(buf2,"$N is unaffected by your %s!",pcVar8);
        pcVar14 = "You are unaffected by $n\'s %s!";
        goto LAB_002ed526;
      }
      sprintf(buf1,"$n is unaffected by $s %s.",pcVar8);
      pcVar14 = "You are unaffected by your %s.";
      pcVar9 = buf2;
    }
    else {
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar12 = strlen(pcVar8);
        if (pcVar8[sVar12 - 1] == '*') {
          pcVar14 = palloc_string(pcVar8);
          chop(pcVar14);
          if (bVar4) {
            free_pstring(pcVar8);
          }
          pcVar8 = palloc_string(pcVar14);
          free_pstring(pcVar14);
          ppCVar13 = &victim->in_room->people;
          while( true ) {
            uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb88 >> 0x20);
            pCVar1 = *ppCVar13;
            if (pCVar1 == (CHAR_DATA *)0x0) break;
            if (pCVar1 != victim && pCVar1 != ch) {
              if (iVar6 < victim->max_hit) {
                pcVar14 = get_char_color(pCVar1,"damage");
                pcVar9 = END_COLOR(pCVar1);
                in_stack_fffffffffffffb88 = get_descr_form(victim,pCVar1,false);
                sprintf(buf1,"%s %s%s%s %s%c",pcVar8,pcVar14,local_468,pcVar9,
                        in_stack_fffffffffffffb88,uVar2);
              }
              else {
                pcVar14 = get_descr_form(victim,pCVar1,false);
                sprintf(buf1,"%s slays %s outright!",pcVar8,pcVar14);
              }
              act(buf1,ch,(void *)0x0,pCVar1,2);
            }
            ppCVar13 = &pCVar1->next_in_room;
          }
          if (ch == victim) {
            if (victim->max_hit <= iVar6) {
              pcVar14 = "Your %s slays you outright!";
              goto LAB_002ed607;
            }
            pcVar9 = get_char_color(ch,"damage");
            pcVar10 = END_COLOR(ch);
            pcVar14 = "Your %s %s%s%s you%c";
LAB_002ed5db:
            uVar15 = CONCAT44(uVar16,uVar2);
            sprintf(buf2,pcVar14 + 5,pcVar8,pcVar9,local_468,pcVar10,uVar15);
            uVar16 = (undefined4)((ulong)uVar15 >> 0x20);
          }
          else {
            if (iVar6 < victim->max_hit) {
              pcVar9 = get_char_color(ch,"damage");
              pcVar10 = END_COLOR(ch);
              pcVar14 = "Your %s %s%s%s $N%c";
              goto LAB_002ed5db;
            }
            pcVar14 = "Your %s slays $N outright!";
LAB_002ed607:
            sprintf(buf2,pcVar14 + 5,pcVar8);
          }
          if (victim->max_hit <= iVar6) {
            pcVar14 = "%s slays you outright!";
            goto LAB_002ed67a;
          }
          pcVar14 = get_char_color(victim,"damage");
          pcVar9 = END_COLOR(victim);
          sprintf(buf3,"%s %s%s%s you%c",pcVar8,pcVar14,local_468,pcVar9,CONCAT44(uVar16,uVar2));
          goto LAB_002ed684;
        }
      }
LAB_002ed23d:
      ppCVar13 = &victim->in_room->people;
      if (ch == victim) {
        while( true ) {
          uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb88 >> 0x20);
          pCVar1 = *ppCVar13;
          if (pCVar1 == (CHAR_DATA *)0x0) break;
          if (pCVar1 != ch) {
            if (iVar6 < victim->max_hit) {
              pcVar14 = get_char_color(pCVar1,"damage");
              pcVar9 = END_COLOR(pCVar1);
              in_stack_fffffffffffffb88 = (char *)CONCAT44(uVar16,uVar2);
              sprintf(buf1,"$n\'s %s %s%s%s $m%c",pcVar8,pcVar14,local_468,pcVar9,
                      in_stack_fffffffffffffb88);
            }
            else {
              sprintf(buf1,"$n\'s %s slays $m outright!",pcVar8);
            }
            act(buf1,ch,(void *)0x0,pCVar1,2);
          }
          ppCVar13 = &pCVar1->next_in_room;
        }
        if (iVar6 < victim->max_hit) {
          pcVar14 = get_char_color(ch,"damage");
          pcVar9 = END_COLOR(ch);
          sprintf(buf2,"Your %s %s%s%s you%c",pcVar8,pcVar14,local_468,pcVar9,CONCAT44(uVar16,uVar2)
                 );
        }
        else {
          sprintf(buf2,"Your %s slays you outright!",pcVar8);
        }
        bVar3 = false;
        goto LAB_002ed68a;
      }
      while( true ) {
        uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb88 >> 0x20);
        pCVar1 = *ppCVar13;
        if (pCVar1 == (CHAR_DATA *)0x0) break;
        if (pCVar1 != victim && pCVar1 != ch) {
          if (iVar6 < victim->max_hit) {
            pcVar14 = get_char_color(pCVar1,"damage");
            pcVar9 = END_COLOR(pCVar1);
            in_stack_fffffffffffffb88 = get_descr_form(victim,pCVar1,false);
            sprintf(buf1,"$n\'s %s %s%s%s %s%c",pcVar8,pcVar14,local_468,pcVar9,
                    in_stack_fffffffffffffb88,uVar2);
          }
          else {
            pcVar14 = get_descr_form(victim,pCVar1,false);
            sprintf(buf1,"$n\'s %s slays %s outright!",pcVar8,pcVar14);
          }
          act(buf1,ch,(void *)0x0,pCVar1,2);
        }
        ppCVar13 = &pCVar1->next_in_room;
      }
      if (iVar6 < victim->max_hit) {
        pcVar14 = get_char_color(ch,"damage");
        pcVar9 = END_COLOR(ch);
        uVar15 = CONCAT44(uVar16,uVar2);
        sprintf(buf2,"Your %s %s%s%s $N%c",pcVar8,pcVar14,local_468,pcVar9,uVar15);
        uVar16 = (undefined4)((ulong)uVar15 >> 0x20);
      }
      else {
        sprintf(buf2,"Your %s slays $N outright!",pcVar8);
      }
      if (iVar6 < victim->max_hit) {
        pcVar14 = get_char_color(victim,"damage");
        pcVar9 = END_COLOR(victim);
        bVar3 = false;
        sprintf(buf3,"$n\'s %s %s%s%s you%c",pcVar8,pcVar14,local_468,pcVar9,CONCAT44(uVar16,uVar2))
        ;
        goto LAB_002ed68a;
      }
      pcVar14 = "$n\'s %s slays you outright!";
LAB_002ed526:
      pcVar9 = buf3;
    }
    bVar3 = false;
    sprintf(pcVar9,pcVar14,pcVar8);
    goto LAB_002ed68a;
  }
  if (ch == victim) {
    if (iVar6 < victim->max_hit) {
      sprintf(buf1,"$n %s $mself%c",local_468,(ulong)uVar2);
      pcVar9 = get_char_color(ch,"damage");
      pcVar10 = END_COLOR(ch);
      __format = "You %s%s%s yourself%c";
      pcVar8 = buf2;
      goto LAB_002ece9f;
    }
    buf1[0x10] = 'y';
    buf1[0x11] = 's';
    buf1[0x12] = ' ';
    buf1[0x13] = '$';
    buf1[0x14] = 'm';
    buf1[0x15] = 's';
    buf1[0x16] = 'e';
    buf1[0x17] = 'l';
    buf1[0x18] = 'f';
    buf1[0x19] = ' ';
    buf1[0x1a] = 'o';
    buf1[0x1b] = 'u';
    buf1[0x1c] = 't';
    buf1[0x1d] = 'r';
    buf1[0x1e] = 'i';
    buf1[0x1f] = 'g';
    buf1[0] = '$';
    buf1[1] = 'n';
    buf1[2] = '\'';
    buf1[3] = 's';
    buf1[4] = ' ';
    buf1[5] = 'a';
    buf1[6] = 's';
    buf1[7] = 's';
    buf1[8] = 'a';
    buf1[9] = 'u';
    buf1[10] = 'l';
    buf1[0xb] = 't';
    buf1[0xc] = ' ';
    buf1[0xd] = 's';
    buf1[0xe] = 'l';
    buf1[0xf] = 'a';
    builtin_strncpy(buf1 + 0x20,"ht!",4);
    buf2[0] = 'Y';
    buf2[1] = 'o';
    buf2[2] = 'u';
    buf2[3] = 'r';
    buf2[4] = ' ';
    buf2[5] = 'a';
    buf2[6] = 's';
    buf2[7] = 's';
    buf2[8] = 'a';
    buf2[9] = 'u';
    buf2[10] = 'l';
    buf2[0xb] = 't';
    buf2[0xc] = ' ';
    buf2[0xd] = 's';
    buf2[0xe] = 'l';
    buf2[0xf] = 'a';
    buf2[0x10] = 'y';
    buf2[0x11] = 's';
    buf2[0x12] = ' ';
    buf2[0x13] = 'y';
    buf2[0x14] = 'o';
    buf2[0x15] = 'u';
    buf2[0x16] = ' ';
    buf2[0x17] = 'o';
    buf2[0x18] = 'u';
    buf2[0x19] = 't';
    buf2[0x1a] = 'r';
    buf2[0x1b] = 'i';
    buf2[0x1c] = 'g';
    buf2[0x1d] = 'h';
    buf2[0x1e] = 't';
    buf2[0x1f] = '!';
    buf2[0x20] = '\0';
  }
  else {
    ppCVar13 = &victim->in_room->people;
    while( true ) {
      uVar16 = (undefined4)((ulong)in_stack_fffffffffffffb88 >> 0x20);
      pCVar1 = *ppCVar13;
      if (pCVar1 == (CHAR_DATA *)0x0) break;
      if (pCVar1 != victim && pCVar1 != ch) {
        if (iVar6 < victim->max_hit) {
          pcVar8 = get_char_color(pCVar1,"damage");
          pcVar9 = END_COLOR(pCVar1);
          pcVar10 = get_descr_form(victim,pCVar1,false);
          in_stack_fffffffffffffb88 = (char *)CONCAT44(uVar16,uVar2);
          sprintf(buf1,"$n %s%s%s %s%c",pcVar8,local_468,pcVar9,pcVar10,in_stack_fffffffffffffb88);
        }
        else {
          pcVar8 = get_descr_form(victim,pCVar1,false);
          sprintf(buf1,"$n\'s assault slays %s outright!",pcVar8);
        }
        act(buf1,ch,(void *)0x0,pCVar1,2);
      }
      ppCVar13 = &pCVar1->next_in_room;
    }
    pcVar8 = get_char_color(ch,"damage");
    pcVar9 = END_COLOR(ch);
    sprintf(buf2,"You %s%s%s $N%c",pcVar8,pcVar14,pcVar9,(ulong)uVar2);
    pcVar9 = get_char_color(victim,"damage");
    pcVar10 = END_COLOR(victim);
    __format = "$n %s%s%s you%c";
    pcVar8 = buf3;
    pcVar14 = local_468;
LAB_002ece9f:
    sprintf(pcVar8,__format,pcVar9,pcVar14,pcVar10);
  }
  pcVar8 = (char *)0x0;
  bVar3 = false;
  bVar4 = false;
LAB_002ed68a:
  bVar5 = str_cmp(pcVar8,"");
  if (!bVar5) {
    sprintf(buf97,"Log: Damage without noun. Char: %s, Victim: %s, DT: %d",ch->true_name,
            victim->true_name);
    wiznet(buf97,(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,0x16,0,0);
  }
  if (ch == victim) {
    act_new(buf2,ch,(void *)0x0,(void *)0x0,3,2);
  }
  else {
    if ((!bVar3) || (ch->in_room == victim->in_room)) {
      act(buf2,ch,(void *)0x0,victim,3);
    }
    act(buf3,ch,(void *)0x0,victim,2);
  }
  if (bVar4) {
    free_pstring(pcVar8);
  }
  return;
}

Assistant:

void dam_message(CHAR_DATA *ch, CHAR_DATA *victim, int dam, int dt, bool immune, char *dnoun, bool reduced)
{
	char buf1[256], buf2[256], buf3[256], buf97[256];
	OBJ_DATA *wield;
	CHAR_DATA *gch;
	const char *vs;
	const char *vp;
	char *attack = nullptr, *attack2;
	char punct;
	int prop;
	bool asterisk = false, duped = false;

	if (dam < 0)
		prop = 0;
	else
		prop = dam;

	if (ch == nullptr || victim == nullptr || !victim->in_room || !ch->in_room)
		return;

	if (reduced)
	{
		vs = "\x01B[0mfail to harm";
		vp = "\x01B[0mfails to harm";
	}
	else if (prop == 0)
	{
		vs = "miss";
		vp = "misses";
	}
	else if (prop <= 2)
	{
		vs = "scratch";
		vp = "scratches";
	}
	else if (prop <= 4)
	{
		vs = "graze";
		vp = "grazes";
	}
	else if (prop <= 7)
	{
		vs = "hit";
		vp = "hits";
	}
	else if (prop <= 11)
	{
		vs = "injure";
		vp = "injures";
	}
	else if (prop <= 15)
	{
		vs = "wound";
		vp = "wounds";
	}
	else if (prop <= 20)
	{
		vs = "maul";
		vp = "mauls";
	}
	else if (prop <= 25)
	{
		vs = "decimate";
		vp = "decimates";
	}
	else if (prop <= 30)
	{
		vs = "devastate";
		vp = "devastates";
	}
	else if (prop <= 37)
	{
		vs = "maim";
		vp = "maims";
	}
	else if (prop <= 45)
	{
		vs = "MUTILATE";
		vp = "MUTILATES";
	}
	else if (prop <= 55)
	{
		vs = "EVISCERATE";
		vp = "EVISCERATES";
	}
	else if (prop <= 65)
	{
		vs = "DISMEMBER";
		vp = "DISMEMBERS";
	}
	else if (prop <= 85)
	{
		vs = "MASSACRE";
		vp = "MASSACRES";
	}
	else if (prop <= 100)
	{
		vs = "MANGLE";
		vp = "MANGLES";
	}
	else if (prop <= 135)
	{
		vs = "*** DEMOLISH ***";
		vp = "*** DEMOLISHES ***";
	}
	else if (prop <= 160)
	{
		vs = "*** DEVASTATE ***";
		vp = "*** DEVASTATES ***";
	}
	else if (prop <= 250)
	{
		vs = "=== OBLITERATE ===";
		vp = "=== OBLITERATES ===";
	}
	else if (prop <= 330)
	{
		vs = ">>> ANNIHILATE <<<";
		vp = ">>> ANNIHILATES <<<";
	}
	else if (prop <= 380)
	{
		vs = "<<< ERADICATE >>>";
		vp = "<<< ERADICATES >>>";
	}
	else
	{
		vs = "do UNSPEAKABLE things to";
		vp = "does UNSPEAKABLE things to";
	}

	punct = (prop <= 33) ? '.' : '!';

	/* Now quickly set dual wield weapon dt to real weapon dt - this allows
	dual wielded weapons to be kept track of until this point, now we no
	longer need to know if the weapon doing the dam is the dual one, just what
	it's actual dt is
	-Ceran
	*/
	if (dt == gsn_dual_wield)
	{
		if (dt == gsn_dual_wield)
			wield = get_eq_char(ch, WEAR_DUAL_WIELD);

		dt = TYPE_HIT;

		if (wield != nullptr)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (dt == TYPE_HIT)
	{
		if (ch == victim)
		{
			if (prop < victim->max_hit)
			{
				sprintf(buf1, "$n %s $mself%c", vp, punct);
				sprintf(buf2, "You %s%s%s yourself%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			}
			else
			{
				sprintf(buf1, "$n's assault slays $mself outright!");
				sprintf(buf2, "Your assault slays you outright!");
			}
		}
		else
		{
			for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
			{
				if (gch != ch && gch != victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf1, "$n %s%s%s %s%c", get_char_color(gch, "damage"), vp, END_COLOR(gch), get_descr_form(victim, gch, false), punct);
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
					else
					{
						sprintf(buf1, "$n's assault slays %s outright!", get_descr_form(victim, gch, false));
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}
			}

			sprintf(buf2, "You %s%s%s $N%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			sprintf(buf3, "$n %s%s%s you%c", get_char_color(victim, "damage"), vp, END_COLOR(victim), punct);
		}
	}
	else
	{
		if (dt >= 0 && dt < MAX_SKILL)
		{
			attack = skill_table[dt].noun_damage;
		}
		else if (dt >= TYPE_HIT && dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		{
			attack = attack_table[dt - TYPE_HIT].noun;
		}
		else
		{
			dt = TYPE_HIT + 17;
			attack = attack_table[0].noun;
		}

		if (dnoun)
		{
			duped = true;
			attack = palloc_string(dnoun);
		}

		if (attack && attack[strlen(attack) - 1] == '$')
		{
			vp = vs;
			attack2 = palloc_string(attack);

			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}
		else if (attack && attack[strlen(attack) - 1] == '#')
		{
			vs = vp;
			attack2 = palloc_string(attack);
			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}

		if (immune)
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);

				asterisk = true;

				sprintf(buf1, "$N is unaffected by %s!", attack);
				if (ch == victim)
					sprintf(buf2, "You are unaffected by %s!", attack);
				else
					sprintf(buf2, "$N is unaffected by %s!", attack);

				sprintf(buf3, "You are unaffected by %s!", attack);
			}
			else
			{
				if (ch == victim)
				{
					sprintf(buf1, "$n is unaffected by $s %s.", attack);
					sprintf(buf2, "You are unaffected by your %s.", attack);
				}
				else
				{
					sprintf(buf1, "$N is unaffected by $n's %s!", attack);
					sprintf(buf2, "$N is unaffected by your %s!", attack);
					sprintf(buf3, "You are unaffected by $n's %s!", attack);
				}
			}
		}
		else
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);
				asterisk = true;

				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "%s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "%s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (ch == victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s you%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays you outright!", attack);
					}
				}
				else
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s $N%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays $N outright!", attack);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "%s %s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "%s slays you outright!", attack);
				}
			}
			else if (ch == victim)
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s $m%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays $m outright!", attack);
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s you%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays you outright!", attack);
				}
			}
			else
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s $N%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays $N outright!", attack);
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "$n's %s \%s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "$n's %s slays you outright!", attack);
				}
			}
		}
	}

	if (!str_cmp(attack, ""))
	{
		sprintf(buf97, "Log: Damage without noun. Char: %s, Victim: %s, DT: %d", ch->true_name, victim->true_name, dt);
		wiznet(buf97, nullptr, nullptr, WIZ_LOG, 0, 0);
	}

	if (ch == victim)
	{
		act_new(buf2, ch, nullptr, nullptr, TO_CHAR, POS_INCAP);
	}
	else
	{
		if (!(asterisk && ch->in_room != victim->in_room))
			act(buf2, ch, nullptr, victim, TO_CHAR);

		act(buf3, ch, nullptr, victim, TO_VICT);
	}

	if (duped)
		free_pstring(attack);
}